

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SelectAddColumnTypeAndCollation(Parse *pParse,Table *pTab,Select *pSelect)

{
  ExprList *pEVar1;
  Expr *pExpr;
  char cVar2;
  LogEst LVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  CollSeq *pCVar8;
  int m;
  int n;
  char *zType;
  u64 szAll;
  ExprList_item *a;
  Expr *p;
  int i;
  CollSeq *pColl;
  Column *pCol;
  NameContext sNC;
  sqlite3 *db;
  Select *pSelect_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  sNC._48_8_ = pParse->db;
  zType = (char *)0x0;
  if (((sqlite3 *)sNC._48_8_)->mallocFailed == '\0') {
    memset(&pCol,0,0x38);
    sNC.pParse = (Parse *)pSelect->pSrc;
    pEVar1 = pSelect->pEList;
    p._4_4_ = 0;
    pColl = (CollSeq *)pTab->aCol;
    for (; p._4_4_ < pTab->nCol; p._4_4_ = p._4_4_ + 1) {
      pExpr = pEVar1->a[p._4_4_].pExpr;
      pcVar6 = columnTypeImpl((NameContext *)&pCol,pExpr,(char **)0x0,(char **)0x0,(char **)0x0,
                              (u8 *)((long)&pColl->xCmp + 2));
      zType = zType + *(byte *)((long)&pColl->xCmp + 2);
      cVar2 = sqlite3ExprAffinity(pExpr);
      *(char *)((long)&pColl->xCmp + 1) = cVar2;
      if ((pcVar6 != (char *)0x0) && (iVar4 = sqlite3Strlen30(pcVar6), 0 < iVar4)) {
        iVar5 = sqlite3Strlen30(pColl->zName);
        pcVar7 = (char *)sqlite3DbReallocOrFree
                                   ((sqlite3 *)sNC._48_8_,pColl->zName,(long)(iVar5 + iVar4 + 2));
        pColl->zName = pcVar7;
        if (pColl->zName != (char *)0x0) {
          memcpy(pColl->zName + (iVar5 + 1),pcVar6,(long)(iVar4 + 1));
          *(byte *)((long)&pColl->xCmp + 3) = *(byte *)((long)&pColl->xCmp + 3) | 4;
        }
      }
      if (*(char *)((long)&pColl->xCmp + 1) == '\0') {
        *(undefined1 *)((long)&pColl->xCmp + 1) = 0x41;
      }
      pCVar8 = sqlite3ExprCollSeq(pParse,pExpr);
      if ((pCVar8 != (CollSeq *)0x0) && (pColl->pUser == (void *)0x0)) {
        pcVar6 = sqlite3DbStrDup((sqlite3 *)sNC._48_8_,pCVar8->zName);
        pColl->pUser = pcVar6;
      }
      pColl = (CollSeq *)&pColl->xDel;
    }
    LVar3 = sqlite3LogEst((long)zType << 2);
    pTab->szTabRow = LVar3;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectAddColumnTypeAndCollation(
  Parse *pParse,        /* Parsing contexts */
  Table *pTab,          /* Add column type information to this table */
  Select *pSelect       /* SELECT used to determine types and collations */
){
  sqlite3 *db = pParse->db;
  NameContext sNC;
  Column *pCol;
  CollSeq *pColl;
  int i;
  Expr *p;
  struct ExprList_item *a;
  u64 szAll = 0;

  assert( pSelect!=0 );
  assert( (pSelect->selFlags & SF_Resolved)!=0 );
  assert( pTab->nCol==pSelect->pEList->nExpr || db->mallocFailed );
  if( db->mallocFailed ) return;
  memset(&sNC, 0, sizeof(sNC));
  sNC.pSrcList = pSelect->pSrc;
  a = pSelect->pEList->a;
  for(i=0, pCol=pTab->aCol; i<pTab->nCol; i++, pCol++){
    const char *zType;
    int n, m;
    p = a[i].pExpr;
    zType = columnType(&sNC, p, 0, 0, 0, &pCol->szEst);
    szAll += pCol->szEst;
    pCol->affinity = sqlite3ExprAffinity(p);
    if( zType && (m = sqlite3Strlen30(zType))>0 ){
      n = sqlite3Strlen30(pCol->zName);
      pCol->zName = sqlite3DbReallocOrFree(db, pCol->zName, n+m+2);
      if( pCol->zName ){
        memcpy(&pCol->zName[n+1], zType, m+1);
        pCol->colFlags |= COLFLAG_HASTYPE;
      }
    }
    if( pCol->affinity==0 ) pCol->affinity = SQLITE_AFF_BLOB;
    pColl = sqlite3ExprCollSeq(pParse, p);
    if( pColl && pCol->zColl==0 ){
      pCol->zColl = sqlite3DbStrDup(db, pColl->zName);
    }
  }
  pTab->szTabRow = sqlite3LogEst(szAll*4);
}